

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LockFreeQueue.h
# Opt level: O0

void __thiscall
NotLockFreeQueue<std::packaged_task<void_()>_>::push_and_wait
          (NotLockFreeQueue<std::packaged_task<void_()>_> *this,packaged_task<void_()> *item)

{
  unique_lock<std::mutex> *__lock;
  condition_variable *in_RDI;
  unique_lock<std::mutex> m;
  unique_lock<std::mutex> *in_stack_ffffffffffffffc0;
  anon_class_8_1_8991fb9c in_stack_ffffffffffffffd0;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffc0,(mutex_type *)in_RDI);
  __lock = (unique_lock<std::mutex> *)
           std::
           queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
           ::size((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
                   *)0x10fb0e);
  if (*(unique_lock<std::mutex> **)(in_RDI + 0x50) <= __lock) {
    std::condition_variable::
    wait<NotLockFreeQueue<std::packaged_task<void()>>::push_and_wait(std::packaged_task<void()>&&)::_lambda()_1_>
              (in_RDI,__lock,in_stack_ffffffffffffffd0);
  }
  std::
  queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
  ::push((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
          *)__lock,(value_type *)in_RDI);
  std::unique_lock<std::mutex>::unlock(__lock);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(__lock);
  return;
}

Assistant:

void NotLockFreeQueue<T>::push_and_wait(T&& item) {
    std::unique_lock<std::mutex> m(mutex);
    if (queue.size() >= max_size) {
        cond_var_push.wait(m, [this]{return queue.size() < max_size;});
    }
    queue.push(std::move(item));
    m.unlock();
    cond_var_pop.notify_one();
}